

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_New_Library(FT_Memory memory,FT_Library *alibrary)

{
  FT_Memory pFVar1;
  int local_2c [2];
  FT_Error error;
  FT_Library library;
  FT_Library *alibrary_local;
  FT_Memory memory_local;
  
  stack0xffffffffffffffd8 = 0;
  if ((memory == (FT_Memory)0x0) || (alibrary == (FT_Library *)0x0)) {
    memory_local._4_4_ = 6;
  }
  else {
    library = (FT_Library)alibrary;
    alibrary_local = (FT_Library *)memory;
    pFVar1 = (FT_Memory)ft_mem_alloc(memory,0x160,local_2c);
    if (local_2c[0] == 0) {
      pFVar1->user = alibrary_local;
      *(undefined4 *)&pFVar1->alloc = 2;
      *(undefined4 *)((long)&pFVar1->alloc + 4) = 9;
      *(undefined4 *)&pFVar1->free = 0;
      *(undefined4 *)&pFVar1[10].realloc = 1;
      library->memory = pFVar1;
      memory_local._4_4_ = 0;
    }
    else {
      memory_local._4_4_ = local_2c[0];
    }
  }
  return memory_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Library( FT_Memory    memory,
                  FT_Library  *alibrary )
  {
    FT_Library  library = NULL;
    FT_Error    error;


    if ( !memory || !alibrary )
      return FT_THROW( Invalid_Argument );

#ifdef FT_DEBUG_LEVEL_ERROR
    /* init debugging support */
    ft_debug_init();
#endif

    /* first of all, allocate the library object */
    if ( FT_NEW( library ) )
      return error;

    library->memory = memory;

#ifdef FT_CONFIG_OPTION_PIC
    /* initialize position independent code containers */
    error = ft_pic_container_init( library );
    if ( error )
      goto Fail;
#endif

    library->version_major = FREETYPE_MAJOR;
    library->version_minor = FREETYPE_MINOR;
    library->version_patch = FREETYPE_PATCH;

    library->refcount = 1;

    /* That's ok now */
    *alibrary = library;

    return FT_Err_Ok;

#ifdef FT_CONFIG_OPTION_PIC
  Fail:
    ft_pic_container_destroy( library );
    FT_FREE( library );
    return error;
#endif
  }